

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Ray * __thiscall
pbrt::AnimatedTransform::operator()
          (Ray *__return_storage_ptr__,AnimatedTransform *this,Ray *r,Float *tMax)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uintptr_t uVar5;
  undefined1 auVar6 [16];
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  Interval<float> i_04;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Float FVar26;
  float fVar27;
  float fVar28;
  Point3fi o;
  Transform t;
  Point3fi local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [12];
  Float FStack_bc;
  Interval<float> local_b8;
  Float local_b0;
  Float local_a8;
  float local_a4;
  Float local_a0;
  undefined1 local_40 [16];
  Interval<float> local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  
  if ((this->actuallyAnimated != true) || (fVar27 = r->time, fVar27 <= this->startTime)) {
    fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
    auVar8._4_4_ = fVar27;
    auVar8._0_4_ = fVar27;
    auVar8._8_4_ = fVar27;
    auVar8._12_4_ = fVar27;
    fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
    auVar6._4_4_ = fVar27;
    auVar6._0_4_ = fVar27;
    auVar6._8_4_ = fVar27;
    auVar6._12_4_ = fVar27;
    local_138.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar8,auVar6);
    fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar20._4_4_ = fVar27;
    auVar20._0_4_ = fVar27;
    auVar20._8_4_ = fVar27;
    auVar20._12_4_ = fVar27;
    local_138.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)vmovlps_avx(auVar20);
    Transform::operator()((Point3fi *)local_c8,&this->startTransform,&local_138);
    fVar27 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar28 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->startTransform).m.m[0][1])),
                             ZEXT416((uint)fVar27),ZEXT416((uint)(this->startTransform).m.m[0][0]));
    local_e8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                               ZEXT416((uint)(this->startTransform).m.m[0][2]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->startTransform).m.m[1][1])),
                             ZEXT416((uint)fVar27),ZEXT416((uint)(this->startTransform).m.m[1][0]));
    local_f8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                               ZEXT416((uint)(this->startTransform).m.m[1][2]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->startTransform).m.m[2][1])),
                             ZEXT416((uint)fVar27),ZEXT416((uint)(this->startTransform).m.m[2][0]));
    local_d8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                               ZEXT416((uint)(this->startTransform).m.m[2][2]));
  }
  else {
    if (fVar27 < this->endTime) {
      Interpolate((Transform *)local_c8,this,fVar27);
      fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
      auVar7._4_4_ = fVar27;
      auVar7._0_4_ = fVar27;
      auVar7._8_4_ = fVar27;
      auVar7._12_4_ = fVar27;
      fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
      auVar17._4_4_ = fVar27;
      auVar17._0_4_ = fVar27;
      auVar17._8_4_ = fVar27;
      auVar17._12_4_ = fVar27;
      local_40 = vmovlhps_avx(auVar7,auVar17);
      fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
      auVar18._4_4_ = fVar27;
      auVar18._0_4_ = fVar27;
      auVar18._8_4_ = fVar27;
      auVar18._12_4_ = fVar27;
      local_30 = (Interval<float>)vmovlps_avx(auVar18);
      Transform::operator()(&local_138,(Transform *)local_c8,(Point3fi *)local_40);
      fVar27 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
      fVar28 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (float)local_c8._4_4_)),ZEXT416((uint)fVar27)
                               ,ZEXT416((uint)local_c8._0_4_));
      local_e8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)local_c8._8_4_));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * local_b8.high)),ZEXT416((uint)fVar27),
                               ZEXT416((uint)local_b8.low));
      local_f8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)local_b0));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * local_a4)),ZEXT416((uint)fVar27),
                               ZEXT416((uint)local_a8));
      local_d8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)local_a0));
      fVar27 = local_d8._0_4_;
      fVar28 = local_f8._0_4_;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),local_e8,local_e8);
      auVar8 = vfmadd231ss_fma(auVar8,local_d8,local_d8);
      auVar19._0_12_ = ZEXT812(0);
      auVar19._12_4_ = 0;
      if (0.0 < auVar8._0_4_) {
        auVar24._8_4_ = 0x7fffffff;
        auVar24._0_8_ = 0x7fffffff7fffffff;
        auVar24._12_4_ = 0x7fffffff;
        auVar6 = vandps_avx(local_e8,auVar24);
        auVar20 = vandps_avx(local_f8,auVar24);
        auVar9 = vandps_avx(local_d8,auVar24);
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 0.0)),auVar19,auVar6);
        auVar6 = vfmadd231ss_fma(auVar6,auVar19,auVar9);
        fVar16 = auVar6._0_4_ / auVar8._0_4_;
        fVar1 = local_e8._0_4_ * fVar16;
        local_118 = ZEXT416((uint)(fVar28 * fVar16));
        local_108 = ZEXT416((uint)(fVar27 * fVar16));
        i.high = fVar1;
        i.low = fVar1;
        auVar10._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_138,i);
        auVar10._8_56_ = extraout_var;
        uVar2 = vmovlps_avx(auVar10._0_16_);
        local_138.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)(int)uVar2;
        local_138.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
             (float)(int)((ulong)uVar2 >> 0x20);
        i_00.high = (float)local_118._0_4_;
        i_00.low = (float)local_118._0_4_;
        auVar11._0_8_ =
             Interval<float>::operator+<float>
                       (&local_138.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
        auVar11._8_56_ = extraout_var_00;
        uVar2 = vmovlps_avx(auVar11._0_16_);
        local_138.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)uVar2;
        local_138.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
             (float)(int)((ulong)uVar2 >> 0x20);
        i_01.high = (float)local_108._0_4_;
        i_01.low = (float)local_108._0_4_;
        auVar12._0_8_ =
             Interval<float>::operator+<float>
                       (&local_138.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
        auVar12._8_56_ = extraout_var_01;
        fVar27 = local_d8._0_4_;
        local_138.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
             (Interval<float>)vmovlps_avx(auVar12._0_16_);
        if (tMax != (Float *)0x0) {
          *tMax = *tMax - fVar16;
        }
      }
      auVar8 = vinsertps_avx(local_e8,local_f8,0x10);
      local_138.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low =
           local_138.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
           local_138.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
      FVar26 = r->time;
      uVar5 = (r->medium).
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      auVar6 = vinsertps_avx((undefined1  [16])
                             local_138.super_Point3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_,
                             ZEXT416((uint)local_138.super_Point3<pbrt::Interval<float>_>.
                                           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high
                                    ),0x10);
      goto LAB_004d597d;
    }
    fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
    auVar9._4_4_ = fVar27;
    auVar9._0_4_ = fVar27;
    auVar9._8_4_ = fVar27;
    auVar9._12_4_ = fVar27;
    fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
    auVar22._4_4_ = fVar27;
    auVar22._0_4_ = fVar27;
    auVar22._8_4_ = fVar27;
    auVar22._12_4_ = fVar27;
    local_138.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>._0_16_ = vmovlhps_avx(auVar9,auVar22);
    fVar27 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar23._4_4_ = fVar27;
    auVar23._0_4_ = fVar27;
    auVar23._8_4_ = fVar27;
    auVar23._12_4_ = fVar27;
    local_138.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = (Interval<float>)vmovlps_avx(auVar23);
    Transform::operator()((Point3fi *)local_c8,&this->endTransform,&local_138);
    fVar27 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar28 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar1 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->endTransform).m.m[0][1])),
                             ZEXT416((uint)fVar27),ZEXT416((uint)(this->endTransform).m.m[0][0]));
    local_e8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                               ZEXT416((uint)(this->endTransform).m.m[0][2]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->endTransform).m.m[1][1])),
                             ZEXT416((uint)fVar27),ZEXT416((uint)(this->endTransform).m.m[1][0]));
    local_f8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                               ZEXT416((uint)(this->endTransform).m.m[1][2]));
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->endTransform).m.m[2][1])),
                             ZEXT416((uint)fVar27),ZEXT416((uint)(this->endTransform).m.m[2][0]));
    local_d8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),
                               ZEXT416((uint)(this->endTransform).m.m[2][2]));
  }
  fVar27 = local_d8._0_4_;
  fVar28 = local_f8._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * fVar28)),local_e8,local_e8);
  auVar8 = vfmadd231ss_fma(auVar8,local_d8,local_d8);
  if (0.0 < auVar8._0_4_) {
    auVar25._8_4_ = 0x7fffffff;
    auVar25._0_8_ = 0x7fffffff7fffffff;
    auVar25._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx(local_e8,auVar25);
    auVar20 = vandps_avx(local_f8,auVar25);
    auVar9 = vandps_avx(local_d8,auVar25);
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 0.0)),ZEXT816(0),auVar6);
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT816(0),auVar9);
    fVar16 = auVar6._0_4_ / auVar8._0_4_;
    fVar1 = local_e8._0_4_ * fVar16;
    local_118 = ZEXT416((uint)(fVar28 * fVar16));
    local_108 = ZEXT416((uint)(fVar27 * fVar16));
    i_02.high = fVar1;
    i_02.low = fVar1;
    auVar13._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_c8,i_02);
    auVar13._8_56_ = extraout_var_02;
    uVar2 = vmovlps_avx(auVar13._0_16_);
    local_c8._0_4_ = (undefined4)uVar2;
    local_c8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    i_03.high = (float)local_118._0_4_;
    i_03.low = (float)local_118._0_4_;
    auVar14._0_8_ = Interval<float>::operator+<float>((Interval<float> *)(local_c8 + 8),i_03);
    auVar14._8_56_ = extraout_var_03;
    uVar2 = vmovlps_avx(auVar14._0_16_);
    local_c8._8_4_ = (undefined4)uVar2;
    FStack_bc = (Float)((ulong)uVar2 >> 0x20);
    i_04.high = (float)local_108._0_4_;
    i_04.low = (float)local_108._0_4_;
    auVar15._0_8_ = Interval<float>::operator+<float>(&local_b8,i_04);
    auVar15._8_56_ = extraout_var_04;
    fVar27 = local_d8._0_4_;
    local_b8 = (Interval<float>)vmovlps_avx(auVar15._0_16_);
    if (tMax != (Float *)0x0) {
      *tMax = *tMax - fVar16;
    }
  }
  auVar8 = vinsertps_avx(local_e8,local_f8,0x10);
  auVar4._4_4_ = local_c8._4_4_;
  auVar4._0_4_ = local_c8._0_4_;
  auVar4._8_4_ = local_c8._8_4_;
  auVar4._12_4_ = FStack_bc;
  local_138.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  z.low = local_b8.low + local_b8.high;
  FVar26 = r->time;
  uVar5 = (r->medium).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_138.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  y.low = (float)local_c8._8_4_;
  local_138.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
  x.high = (float)local_c8._4_4_;
  auVar6 = vinsertps_avx(auVar4,ZEXT416((uint)FStack_bc),0x10);
LAB_004d597d:
  auVar21._0_4_ =
       local_138.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar6._0_4_;
  auVar21._4_4_ =
       local_138.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar6._4_4_;
  auVar21._8_4_ = auVar6._8_4_ + 0.0;
  auVar21._12_4_ = auVar6._12_4_ + 0.0;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar6 = vmulps_avx512vl(auVar21,auVar3);
  uVar2 = vmovlps_avx(auVar6);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->o).super_Tuple3<pbrt::Point3,_float>.z =
       local_138.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low * 0.5;
  uVar2 = vmovlps_avx(auVar8);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->d).super_Tuple3<pbrt::Vector3,_float>.z = fVar27;
  __return_storage_ptr__->time = FVar26;
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar5;
  return __return_storage_ptr__;
}

Assistant:

Ray AnimatedTransform::operator()(const Ray &r, Float *tMax) const {
    if (!actuallyAnimated || r.time <= startTime)
        return startTransform(r, tMax);
    else if (r.time >= endTime)
        return endTransform(r, tMax);
    else {
        Transform t = Interpolate(r.time);
        return t(r, tMax);
    }
}